

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TtfUtil.cpp
# Opt level: O2

uint TtfUtil::Cmap310NextCodepoint(void *pCmap310,uint nUnicodeId,int *pRangeKey)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint32 nUnicodePrev;
  CmapSubTableFormat12 *pTable;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (nUnicodeId == 0) {
    if (pRangeKey != (int *)0x0) {
      *pRangeKey = 0;
    }
    uVar5 = *(uint *)((long)pCmap310 + 0x10);
    return uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  uVar5 = *(uint *)((long)pCmap310 + 0xc);
  uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  if (nUnicodeId < 0x10ffff) {
    if (pRangeKey == (int *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *pRangeKey;
    }
    uVar6 = (int)uVar2 >> 0x1f & uVar2;
    while ((uVar7 = uVar6, 0 < (int)uVar2 &&
           (uVar3 = *(uint *)((long)pCmap310 + (ulong)uVar2 * 0xc + 0x10), uVar7 = uVar2,
           nUnicodeId <
           (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)))) {
      uVar2 = uVar2 - 1;
    }
    puVar1 = (uint *)((long)pCmap310 + (long)(int)uVar7 * 0xc + 0x14);
    do {
      uVar6 = uVar7;
      puVar4 = puVar1;
      uVar2 = *puVar4;
      uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar7 = uVar6 + 1;
      puVar1 = puVar4 + 3;
    } while (uVar2 < nUnicodeId);
    uVar3 = puVar4[-1];
    uVar8 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    uVar3 = uVar8 - 1;
    if (uVar8 <= nUnicodeId) {
      uVar3 = nUnicodeId;
    }
    if (uVar3 < uVar2) {
      if (pRangeKey != (int *)0x0) {
        *pRangeKey = uVar6;
      }
      return uVar3 + 1;
    }
    if (pRangeKey != (int *)0x0) {
      *pRangeKey = uVar7;
    }
    uVar2 = 0x10ffff;
    if ((int)uVar7 < (int)uVar5) {
      uVar5 = *(uint *)((long)pCmap310 + (long)(int)uVar7 * 0xc + 0x10);
      uVar2 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
    }
  }
  else {
    uVar2 = 0x10ffff;
    if (pRangeKey != (int *)0x0) {
      *pRangeKey = uVar5;
      return 0x10ffff;
    }
  }
  return uVar2;
}

Assistant:

unsigned int Cmap310NextCodepoint(const void *pCmap310, unsigned int nUnicodeId, int * pRangeKey)
{
	const Sfnt::CmapSubTableFormat12 * pTable = reinterpret_cast<const Sfnt::CmapSubTableFormat12 *>(pCmap310);

	int nRange = read(pTable->num_groups);

	uint32 nUnicodePrev = (uint32)nUnicodeId;

	if (nUnicodePrev == 0)
	{
		// return the first codepoint.
		if (pRangeKey)
			*pRangeKey = 0;
		return read(pTable->group[0].start_char_code);
	}
	else if (nUnicodePrev >= 0x10FFFF)
	{
		if (pRangeKey)
			*pRangeKey = nRange;
		return 0x10FFFF;
	}

	int iRange = (pRangeKey) ? *pRangeKey : 0;
	// Just in case we have a bad key:
	while (iRange > 0 && read(pTable->group[iRange].start_char_code) > nUnicodePrev)
		iRange--;
	while (read(pTable->group[iRange].end_char_code) < nUnicodePrev)
		iRange++;

	// Now iRange is the range containing nUnicodePrev.

	unsigned int nStartCode = read(pTable->group[iRange].start_char_code);
	unsigned int nEndCode = read(pTable->group[iRange].end_char_code);

	if (nStartCode > nUnicodePrev)
		// Oops, nUnicodePrev is not in the cmap! Adjust so we get a reasonable
		// answer this time around.
		nUnicodePrev = nStartCode - 1;

	if (nEndCode > nUnicodePrev)
	{
		// Next is in the same range; it is the next successive codepoint.
		if (pRangeKey)
			*pRangeKey = iRange;
		return nUnicodePrev + 1;
	}

	// Otherwise the next codepoint is the first one in the next range, or 10FFFF if we're done.
	if (pRangeKey)
		*pRangeKey = iRange + 1;
	return (iRange + 1 >= nRange) ? 0x10FFFF : read(pTable->group[iRange + 1].start_char_code);
}